

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void allocate_imp_map<ImputedData<long,long_double>,InputData<float,long>>
               (robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *impute_map,InputData<float,_long> *input_data)

{
  void *pvVar1;
  long lVar2;
  robin_iterator<false> rVar3;
  ulong uVar4;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar5;
  tuple<> local_151;
  unsigned_long local_150;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_148;
  pointer pvStack_140;
  pointer local_138;
  ImputedData<long,_long_double> local_128;
  
  local_150 = 0;
  uVar4 = input_data->nrows;
  if (uVar4 != 0) {
    do {
      if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[local_150] != '\0') {
        ImputedData<long,long_double>::ImputedData<InputData<float,long>>
                  ((ImputedData<long,long_double> *)&local_128,input_data,local_150);
        local_148._M_head_impl = &local_150;
        pVar5 = tsl::detail_robin_hash::
                robin_hash<std::pair<unsigned_long,ImputedData<long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                ::
                insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                          ((robin_hash<std::pair<unsigned_long,ImputedData<long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                            *)impute_map,local_148._M_head_impl,
                           (piecewise_construct_t *)&std::piecewise_construct,
                           (tuple<const_unsigned_long_&> *)&local_148,&local_151);
        rVar3 = pVar5.first.m_bucket;
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 8);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0x18);
        *(pointer *)((rVar3.m_bucket)->m_value + 8) =
             local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x10) =
             local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x18) =
             local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0x20);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0x30);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x20) =
             local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x28) =
             local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x30) =
             local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        local_138 = *(pointer *)((rVar3.m_bucket)->m_value + 0x48);
        local_148._M_head_impl = *(unsigned_long **)((rVar3.m_bucket)->m_value + 0x38);
        pvStack_140 = *(pointer *)((rVar3.m_bucket)->m_value + 0x40);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x38) =
             local_128.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x40) =
             local_128.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x48) =
             local_128.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ::~vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   *)&local_148);
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0x50);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0x60);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x50) =
             local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x58) =
             local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x60) =
             local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.cat_weight.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0x68);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0x78);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x68) =
             local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x70) =
             local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x78) =
             local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.sp_num_sum.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0x80);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0x90);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x80) =
             local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x88) =
             local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0x90) =
             local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.sp_num_weight.super__Vector_base<long_double,_std::allocator<long_double>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0x98);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0xa8);
        *(pointer *)((rVar3.m_bucket)->m_value + 0x98) =
             local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xa0) =
             local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xa8) =
             local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.missing_num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 0xb0);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0xc0);
        *(pointer *)((rVar3.m_bucket)->m_value + 0xb0) =
             local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xb8) =
             local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xc0) =
             local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.missing_cat.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        pvVar1 = *(void **)((rVar3.m_bucket)->m_value + 200);
        lVar2 = *(long *)((rVar3.m_bucket)->m_value + 0xd8);
        *(pointer *)((rVar3.m_bucket)->m_value + 200) =
             local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xd0) =
             local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)((rVar3.m_bucket)->m_value + 0xd8) =
             local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.missing_sp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,lVar2 - (long)pvVar1);
        }
        *(size_t *)((rVar3.m_bucket)->m_value + 0xf0) = local_128.n_missing_sp;
        *(size_t *)((rVar3.m_bucket)->m_value + 0xe0) = local_128.n_missing_num;
        *(size_t *)((rVar3.m_bucket)->m_value + 0xe8) = local_128.n_missing_cat;
        ImputedData<long,_long_double>::~ImputedData(&local_128);
        uVar4 = input_data->nrows;
      }
      local_150 = local_150 + 1;
    } while (local_150 < uVar4);
  }
  return;
}

Assistant:

void allocate_imp_map(hashed_map<size_t, ImputedData> &impute_map, InputData &input_data)
{
    for (size_t row = 0; row < input_data.nrows; row++)
        if (input_data.has_missing[row])
            impute_map[row] = ImputedData(input_data, row);
}